

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  u8 uVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  char *pEnd_1;
  int iVar14;
  long lVar15;
  sqlite3_int64 iVal;
  char *p_1;
  long local_98;
  byte *local_90;
  byte *local_88;
  long local_80;
  byte *local_78;
  int local_6c;
  byte *local_68;
  byte *local_60;
  byte *local_58;
  int local_4c;
  byte *local_48;
  byte *local_40;
  long local_38;
  
  if (pList == (char *)0x0) {
    sqlite3_free((p->doclist).aAll);
    (p->doclist).aAll = (char *)0x0;
    (p->doclist).nAll = 0;
  }
  else {
    iVar6 = p->iDoclistToken;
    if (iVar6 < 0) {
      (p->doclist).aAll = pList;
      (p->doclist).nAll = nList;
    }
    else {
      pbVar7 = (byte *)(p->doclist).aAll;
      if (pbVar7 != (byte *)0x0) {
        iVar14 = (p->doclist).nAll;
        local_6c = iVar6 - iToken;
        pbVar9 = pbVar7;
        iVar12 = nList;
        if (iVar6 < iToken) {
          local_6c = iToken - iVar6;
          pbVar9 = (byte *)pList;
          pList = (char *)pbVar7;
          iVar12 = iVar14;
          iVar14 = nList;
        }
        uVar1 = pTab->bDescIdx;
        local_68 = (byte *)(long)iVar14;
        pbVar7 = pbVar9;
        if (uVar1 == '\0') {
LAB_001be35d:
          local_78 = pbVar7;
          local_60 = (byte *)pList;
          local_58 = pbVar7;
          if (iVar12 < 1) {
            pbVar7 = (byte *)0x0;
            lVar15 = 0;
          }
          else {
            iVar6 = sqlite3Fts3GetVarint(pList,&local_98);
            pbVar7 = (byte *)pList + iVar6;
            lVar15 = local_98;
          }
          iVar6 = (int)local_58;
          local_88 = pbVar7;
          if (0 < iVar14) {
            iVar6 = sqlite3Fts3GetVarint((char *)pbVar9,&local_98);
            local_90 = pbVar9 + iVar6;
            local_80 = local_98;
            iVar6 = (int)local_58;
            if (pbVar7 != (byte *)0x0) {
              local_48 = local_60 + iVar12;
              local_68 = local_68 + (long)pbVar9;
              bVar3 = false;
              lVar10 = 0;
              local_4c = iToken;
              local_40 = pbVar9;
              do {
                pbVar9 = local_78;
                lVar8 = -(lVar15 - local_80);
                if (uVar1 == '\0') {
                  lVar8 = lVar15 - local_80;
                }
                if (lVar8 == 0) {
                  uVar11 = lVar10 - lVar15;
                  if (!bVar3) {
                    uVar11 = lVar15 - lVar10;
                  }
                  if (uVar1 == '\0') {
                    uVar11 = lVar15 - lVar10;
                  }
                  do {
                    pbVar7 = local_78;
                    bVar4 = (byte)uVar11;
                    *pbVar7 = bVar4 | 0x80;
                    local_78 = pbVar7 + 1;
                    bVar2 = 0x7f < uVar11;
                    uVar11 = uVar11 >> 7;
                  } while (bVar2);
                  *pbVar7 = bVar4;
                  local_38 = lVar10;
                  iVar6 = fts3PoslistPhraseMerge
                                    ((char **)&local_78,local_6c,0,1,(char **)&local_88,
                                     (char **)&local_90);
                  pbVar7 = local_88;
                  lVar10 = lVar15;
                  bVar2 = true;
                  if (iVar6 == 0) {
                    lVar10 = local_38;
                    local_78 = pbVar9;
                    bVar2 = bVar3;
                  }
                  if (local_88 < local_48) {
                    iVar6 = sqlite3Fts3GetVarint((char *)local_88,&local_98);
                    pbVar7 = pbVar7 + iVar6;
                    lVar8 = -local_98;
                    if (uVar1 == '\0') {
                      lVar8 = local_98;
                    }
                    lVar15 = lVar15 + lVar8;
                  }
                  else {
                    pbVar7 = (byte *)0x0;
                  }
                  pbVar9 = local_90;
                  local_88 = pbVar7;
                  if (local_68 <= local_90) goto LAB_001be617;
                  iVar6 = sqlite3Fts3GetVarint((char *)local_90,&local_98);
                  local_90 = pbVar9 + iVar6;
                  lVar8 = -local_98;
                  if (uVar1 == '\0') {
                    lVar8 = local_98;
                  }
                  local_80 = local_80 + lVar8;
                  bVar3 = bVar2;
                }
                else if (lVar8 < 0) {
                  bVar4 = *pbVar7;
                  if (*pbVar7 != 0) {
                    do {
                      pbVar9 = pbVar7 + 1;
                      pbVar7 = pbVar7 + 1;
                      bVar5 = bVar4 & 0x80;
                      bVar4 = *pbVar9;
                    } while (bVar5 != 0 || *pbVar9 != 0);
                  }
                  local_88 = pbVar7 + 1;
                  if (local_48 <= local_88) goto LAB_001be617;
                  iVar6 = sqlite3Fts3GetVarint((char *)local_88,&local_98);
                  pbVar7 = local_88 + iVar6;
                  lVar8 = -local_98;
                  if (uVar1 == '\0') {
                    lVar8 = local_98;
                  }
                  lVar15 = lVar15 + lVar8;
                  local_88 = pbVar7;
                }
                else {
                  bVar4 = *local_90;
                  if (*local_90 != 0) {
                    do {
                      pbVar7 = local_90 + 1;
                      local_90 = local_90 + 1;
                      bVar5 = bVar4 & 0x80;
                      bVar4 = *pbVar7;
                    } while (bVar5 != 0 || *pbVar7 != 0);
                  }
                  local_90 = local_90 + 1;
                  if (local_68 <= local_90) goto LAB_001be617;
                  iVar6 = sqlite3Fts3GetVarint((char *)local_90,&local_98);
                  local_90 = local_90 + iVar6;
                  lVar8 = -local_98;
                  if (uVar1 == '\0') {
                    lVar8 = local_98;
                  }
                  local_80 = local_80 + lVar8;
                  pbVar7 = local_88;
                }
                if ((pbVar7 == (byte *)0x0) || (local_90 == (byte *)0x0)) goto LAB_001be617;
              } while( true );
            }
          }
          goto LAB_001be62a;
        }
        local_80 = CONCAT44(local_80._4_4_,iVar12);
        iVar6 = sqlite3_initialize();
        iVar13 = 7;
        if (iVar6 == 0) {
          pbVar7 = (byte *)sqlite3Malloc((u64)(local_68 + 10));
          iVar12 = (int)local_80;
          if (pbVar7 != (byte *)0x0) goto LAB_001be35d;
        }
        goto LAB_001be644;
      }
      sqlite3_free(pList);
    }
  }
  iVar13 = 0;
  goto LAB_001be653;
LAB_001be617:
  iVar6 = (int)local_78;
  pbVar9 = local_40;
  iToken = local_4c;
LAB_001be62a:
  pbVar7 = local_58;
  iVar14 = iVar6 - (int)local_58;
  iVar13 = 0;
  pList = (char *)local_60;
  if (uVar1 != '\0') {
    sqlite3_free(pbVar9);
    pbVar9 = pbVar7;
    pList = (char *)local_60;
  }
LAB_001be644:
  sqlite3_free(pList);
  (p->doclist).aAll = (char *)pbVar9;
  (p->doclist).nAll = iVar14;
LAB_001be653:
  if (p->iDoclistToken < iToken) {
    p->iDoclistToken = iToken;
  }
  return iVar13;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}